

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::ShaderBitfieldOperationCase::iterate(ShaderBitfieldOperationCase *this)

{
  GLSLVersion version;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  char *testStatement;
  TestError *pTVar3;
  undefined8 uVar4;
  char *local_108;
  Data *results;
  undefined4 local_98;
  GLint linkSuccess;
  GLuint pgm;
  GLint compileSuccess;
  char *strings [1];
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  string csString;
  GLuint cs;
  char *css;
  GLuint data;
  bool isOk;
  Functions *gl;
  ShaderBitfieldOperationCase *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _data = CONCAT44(extraout_var,iVar1);
  css._7_1_ = 1;
  (**(code **)(_data + 0x6c8))(1,&css);
  (**(code **)(_data + 0x40))(0x90d2,css._0_4_);
  (**(code **)(_data + 0x150))(0x90d2,0xd0,&this->m_data,0x88e4);
  (**(code **)(_data + 0x48))(0x90d2,0,css._0_4_);
  csString.field_2._12_4_ = (**(code **)(_data + 0x3f0))(0x91b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "${VERSION_DECL}\n\nlayout(local_size_x = 1) in;\n\nlayout(binding = 0, std430) buffer Data {\n    uvec4 inUvec4;\n    ivec4 inIvec4;\n    vec4 inVec4;\n\n    uvec4 in2Uvec4;\n    ivec4 in2Ivec4;\n    vec4 in2Vec4;\n\n    int offset;\n    int bits;\n\n    uvec4 outUvec4;\n    ivec4 outIvec4;\n    vec4 outVec4;\n\n    uvec4 out2Uvec4;\n    ivec4 out2Ivec4;\n    vec4 out2Vec4;\n};\n\nvoid main()\n{\n    ${TEST_STATEMENT};\n}\n"
             ,&local_71);
  version = this->m_glslVersion;
  testStatement = (char *)std::__cxx11::string::c_str();
  specializeVersion((string *)local_50,&local_70,version,testStatement);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  _pgm = std::__cxx11::string::c_str();
  (**(code **)(_data + 0x12b8))(csString.field_2._12_4_,1,&pgm,0);
  (**(code **)(_data + 0x248))(csString.field_2._12_4_);
  linkSuccess = 0;
  (**(code **)(_data + 0xa70))(csString.field_2._12_4_,0x8b81,&linkSuccess);
  if (linkSuccess == 0) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cShaderBitfieldOperationTests.cpp"
               ,0xc9);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_98 = (**(code **)(_data + 0x3c8))();
  (**(code **)(_data + 0x10))(local_98,csString.field_2._12_4_);
  (**(code **)(_data + 0xce8))(local_98);
  results._4_4_ = 0;
  (**(code **)(_data + 0x9d8))(local_98,0x8b82,(long)&results + 4);
  if (results._4_4_ == 0) {
    (**(code **)(_data + 0x470))(csString.field_2._12_4_);
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Link failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cShaderBitfieldOperationTests.cpp"
               ,0xd4);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_data + 0x1680))(local_98);
  (**(code **)(_data + 0x528))(1,1);
  uVar4 = (**(code **)(_data + 0xd00))(0x90d2,0,0xd0);
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,uVar4);
  css._7_1_ = (byte)iVar1 & 1;
  (**(code **)(_data + 0x1670))(0x90d2);
  (**(code **)(_data + 0x1680))(0);
  (**(code **)(_data + 0x448))(local_98);
  (**(code **)(_data + 0x470))(csString.field_2._12_4_);
  (**(code **)(_data + 0x438))(1,&css);
  if ((css._7_1_ & 1) == 0) {
    local_108 = "Fail";
  }
  else {
    local_108 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)((css._7_1_ & 1) == 0),local_108);
  std::__cxx11::string::~string((string *)local_50);
  return STOP;
}

Assistant:

ShaderBitfieldOperationCase::IterateResult ShaderBitfieldOperationCase::iterate()
{
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	GLuint data;
	gl.genBuffers(1, &data);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, data);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(Data), &m_data, GL_STATIC_DRAW);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, data);

	char const* css = "${VERSION_DECL}\n"
					  "\n"
					  "layout(local_size_x = 1) in;\n"
					  "\n"
					  "layout(binding = 0, std430) buffer Data {\n"
					  "    uvec4 inUvec4;\n"
					  "    ivec4 inIvec4;\n"
					  "    vec4 inVec4;\n"
					  "\n"
					  "    uvec4 in2Uvec4;\n"
					  "    ivec4 in2Ivec4;\n"
					  "    vec4 in2Vec4;\n"
					  "\n"
					  "    int offset;\n"
					  "    int bits;\n"
					  "\n"
					  "    uvec4 outUvec4;\n"
					  "    ivec4 outIvec4;\n"
					  "    vec4 outVec4;\n"
					  "\n"
					  "    uvec4 out2Uvec4;\n"
					  "    ivec4 out2Ivec4;\n"
					  "    vec4 out2Vec4;\n"
					  "};\n"
					  "\n"
					  "void main()\n"
					  "{\n"
					  "    ${TEST_STATEMENT};\n"
					  "}\n";

	GLuint		cs		   = gl.createShader(GL_COMPUTE_SHADER);
	std::string csString   = specializeVersion(css, m_glslVersion, m_testStatement.c_str());
	char const* strings[1] = { csString.c_str() };
	gl.shaderSource(cs, 1, strings, 0);
	gl.compileShader(cs);
	GLint compileSuccess = 0;
	gl.getShaderiv(cs, GL_COMPILE_STATUS, &compileSuccess);
	if (!compileSuccess)
	{
		TCU_FAIL("Compile failed");
	}

	GLuint pgm = gl.createProgram();
	gl.attachShader(pgm, cs);
	gl.linkProgram(pgm);
	GLint linkSuccess = 0;
	gl.getProgramiv(pgm, GL_LINK_STATUS, &linkSuccess);
	if (!linkSuccess)
	{
		gl.deleteShader(cs);
		TCU_FAIL("Link failed");
	}

	gl.useProgram(pgm);

	gl.dispatchCompute(1, 1, 1);

	Data const* results = (Data const*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Data), GL_MAP_READ_BIT);
	isOk				= test(results);
	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);

	gl.useProgram(0);
	gl.deleteProgram(pgm);
	gl.deleteShader(cs);

	gl.deleteBuffers(1, &data);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}